

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O2

void __thiscall
stateObservation::LipmDcmEstimator::LipmDcmEstimator
          (LipmDcmEstimator *this,double dt,double omega_0,double biasDriftStd,
          double dcmMeasureErrorStd,double zmpMeasureErrorStd,Vector2 *biasLimit,Vector2 *initZMP,
          Vector2 *initDcm,Vector2 *initBias,Vector2 *initDcmUncertainty,
          Vector2 *initBiasUncertainty)

{
  LinearKalmanFilter *this_00;
  double dVar1;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_188;
  Vector2 *local_168;
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *local_160;
  double local_158;
  double local_150;
  double local_148;
  double dcmMeasureErrorStd_local;
  Matrix4 P;
  Vector4 x;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_98 [16];
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_88 [16];
  Matrix2 local_78;
  Matrix2 local_58;
  
  this->omega0_ = omega_0;
  local_168 = initDcmUncertainty;
  local_160 = (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initBias;
  local_158 = dt;
  local_150 = biasDriftStd;
  local_148 = zmpMeasureErrorStd;
  dcmMeasureErrorStd_local = dcmMeasureErrorStd;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&this->gamma_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&P);
  this->kappa_ = 1.0;
  this->dt_ = local_158;
  this->biasDriftStd_ = local_150;
  this->zmpErrorStd_ = local_148;
  this->needUpdateMatrices_ = true;
  dVar1 = (initZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[1];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[0] = (initZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[0];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[1] = dVar1;
  dVar1 = (biasLimit->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
          .array[1];
  (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = (biasLimit->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
             m_data.array[0];
  (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = dVar1;
  this_00 = &this->filter_;
  LinearKalmanFilter::LinearKalmanFilter(this_00,4,2,4);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[0] = 1.0;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[1] = 0.0;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[2] = 0.0;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[3] = 1.0;
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_true>::run(&this->A_);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&this->B_);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_true>::run(&this->Q_);
  updateMatricesABQ_(this);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  Eigen::CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>>::
  CommaInitializer<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
            ((CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>> *)&P,&this->C_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              *)&x);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  Eigen::CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>> *)&P,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              *)&local_188);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&P);
  dblToSqDiag_((Matrix2 *)&P,&dcmMeasureErrorStd_local);
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
       = P.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
       = P.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3];
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0]
       = P.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0];
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1]
       = P.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1];
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,2,4,0,2,4>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&P,
             (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&this->C_);
  KalmanFilterBase::setC(&this_00->super_KalmanFilterBase,(Cmatrix *)&P);
  free((void *)P.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
               [0]);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&P,
             (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&this->R_);
  (*(this_00->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase
    [0x2e])(this_00,&P);
  free((void *)P.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
               [0]);
  Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::
  CommaInitializer<Eigen::Matrix<double,2,1,0,2,1>>
            ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&P,&x,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initDcm);
  Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&P,local_160);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&P);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&P,
             (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&x);
  ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)&P,0);
  free((void *)P.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
               [0]);
  Vec2ToSqDiag_(&local_58,local_168);
  Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::
  CommaInitializer<Eigen::Matrix<double,2,2,0,2,2>>
            ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_188,&P,
             (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_58);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Zero();
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_188,local_88);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Zero();
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar2,local_98);
  Vec2ToSqDiag_(&local_78,initBiasUncertainty);
  Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar2,
             (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_78);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished(&local_188);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_188,
             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&P);
  KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,(Pmatrix *)&local_188);
  free(local_188.m_xpr);
  return;
}

Assistant:

LipmDcmEstimator::LipmDcmEstimator(double dt,
                                   double omega_0,
                                   double biasDriftStd,
                                   double dcmMeasureErrorStd,
                                   double zmpMeasureErrorStd,
                                   const Vector2 & biasLimit,
                                   const Vector2 & initZMP,
                                   const Vector2 & initDcm,
                                   const Vector2 & initBias,
                                   const Vector2 & initDcmUncertainty,
                                   const Vector2 & initBiasUncertainty)
: omega0_(omega_0), dt_(dt), biasDriftStd_(biasDriftStd), zmpErrorStd_(zmpMeasureErrorStd), previousZmp_(initZMP),
  biasLimit_(biasLimit), filter_(4, 2, 4), previousOrientation_(Matrix2::Identity())
{
  A_.setIdentity();
  B_.setZero();
  Q_.setIdentity();
  updateMatricesABQ_();
  C_ << Matrix2::Identity(), Matrix2::Identity();
  R_ = dblToSqDiag_(dcmMeasureErrorStd);
  filter_.setC(C_);
  filter_.setMeasurementCovariance(R_);
  Vector4 x;
  x << initDcm, initBias;
  filter_.setState(x, 0);
  Matrix4 P;
  // clang-format off
  P<< Vec2ToSqDiag_(initDcmUncertainty),  Matrix2::Zero(),
      Matrix2::Zero(),                   Vec2ToSqDiag_(initBiasUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}